

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Stress::anon_unknown_0::DrawInvalidRangeCase::deinit(DrawInvalidRangeCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (this->m_buffer != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_buffer);
    this->m_buffer = 0;
  }
  if (this->m_indexBuffer != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))(1,&this->m_indexBuffer);
    this->m_indexBuffer = 0;
  }
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

void DrawInvalidRangeCase::deinit (void)
{
	if (m_buffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_buffer);
		m_buffer = 0;
	}

	if (m_indexBuffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_indexBuffer);
		m_indexBuffer = 0;
	}

	delete m_program;
	m_program = DE_NULL;
}